

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

void __thiscall
helics::FilterFederate::processDestFilterReturn(FilterFederate *this,ActionMessage *command)

{
  uint32_t pid;
  GlobalFederateId fid;
  BasicHandleInfo *handle;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  iterator iVar1;
  FilterCoordinator *fcoord;
  uint32_t local_38;
  BaseType local_34;
  
  handle = HandleManager::getInterfaceHandle
                     (this->mHandles,(InterfaceHandle)(command->dest_handle).hid,ENDPOINT);
  if (handle != (BasicHandleInfo *)0x0) {
    pid = command->sequenceID;
    fid.gid = (handle->handle).fed_id.gid;
    local_34 = fid.gid;
    this_00 = &std::
               map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](&this->ongoingDestFilterProcesses,&local_34)->_M_t;
    _local_38 = CONCAT44(local_34,pid);
    iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (this_00,(key_type *)&local_38);
    if ((_Rb_tree_header *)iVar1._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
      if (command->messageAction != cmd_null_dest_message) {
        fcoord = getFilterCoordinator(this,(InterfaceHandle)(handle->handle).handle.hid);
        if ((fcoord->cloningDestFilters).
            super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (fcoord->cloningDestFilters).
            super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          runCloningDestinationFilters(this,fcoord,handle,command);
        }
        ActionMessage::setAction(command,cmd_send_message);
        std::function<void_(helics::ActionMessage_&&)>::operator()(&this->mSendMessageMove,command);
      }
      acceptDestProcessReturn(this,fid,pid);
    }
  }
  return;
}

Assistant:

void FilterFederate::processDestFilterReturn(ActionMessage& command)
{
    {
        auto* handle = mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::ENDPOINT);
        if (handle == nullptr) {
            return;
        }
        auto mid = command.sequenceID;
        auto fid = handle->getFederateId();

        auto& ongoingDestProcess = ongoingDestFilterProcesses[fid.baseValue()];
        if (ongoingDestProcess.find(mid) != ongoingDestProcess.end()) {
            if (command.action() == CMD_NULL_DEST_MESSAGE) {
                acceptDestProcessReturn(fid, mid);
                return;
            }
            auto* filtFunc = getFilterCoordinator(handle->getInterfaceHandle());

            if (!filtFunc->cloningDestFilters.empty()) {
                runCloningDestinationFilters(filtFunc, handle, command);
            }

            // mCoord->processTimeMessage(command);
            command.setAction(CMD_SEND_MESSAGE);
            mSendMessageMove(std::move(command));
            acceptDestProcessReturn(fid, mid);
        }
    }
}